

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

Iterator * leveldb::Table::BlockReader(void *arg,ReadOptions *options,Slice *index_value)

{
  long *arg1;
  bool bVar1;
  uint64_t value;
  size_t sVar2;
  Iterator *local_c0;
  Iterator *iter;
  Status local_b0;
  undefined1 local_a8 [8];
  Slice key;
  char cache_key_buffer [16];
  undefined1 local_80 [8];
  BlockContents contents;
  Status s;
  Slice input;
  BlockHandle handle;
  Handle *cache_handle;
  Block *block;
  Cache *block_cache;
  Table *table;
  Slice *index_value_local;
  ReadOptions *options_local;
  void *arg_local;
  
  arg1 = *(long **)(*arg + 0x30);
  cache_handle = (Handle *)0x0;
  handle.size_ = 0;
  BlockHandle::BlockHandle((BlockHandle *)&input.size_);
  input.data_ = (char *)index_value->size_;
  BlockHandle::DecodeFrom((BlockHandle *)&contents.cachable,(Slice *)&input.size_);
  bVar1 = Status::ok((Status *)&contents.cachable);
  if (bVar1) {
    BlockContents::BlockContents((BlockContents *)local_80);
    if (arg1 == (long *)0x0) {
      ReadBlock((leveldb *)&iter,*(RandomAccessFile **)(*arg + 0x68),options,
                (BlockHandle *)&input.size_,(BlockContents *)local_80);
      Status::operator=((Status *)&contents.cachable,(Status *)&iter);
      Status::~Status((Status *)&iter);
      bVar1 = Status::ok((Status *)&contents.cachable);
      if (bVar1) {
        cache_handle = (Handle *)operator_new(0x18);
        Block::Block((Block *)cache_handle,(BlockContents *)local_80);
      }
    }
    else {
      EncodeFixed64((char *)&key.size_,*(uint64_t *)(*arg + 0x70));
      value = BlockHandle::offset((BlockHandle *)&input.size_);
      EncodeFixed64(cache_key_buffer,value);
      Slice::Slice((Slice *)local_a8,(char *)&key.size_,0x10);
      handle.size_ = (**(code **)(*arg1 + 0x18))(arg1,local_a8);
      if (handle.size_ == 0) {
        ReadBlock((leveldb *)&local_b0,*(RandomAccessFile **)(*arg + 0x68),options,
                  (BlockHandle *)&input.size_,(BlockContents *)local_80);
        Status::operator=((Status *)&contents.cachable,&local_b0);
        Status::~Status(&local_b0);
        bVar1 = Status::ok((Status *)&contents.cachable);
        if (bVar1) {
          cache_handle = (Handle *)operator_new(0x18);
          Block::Block((Block *)cache_handle,(BlockContents *)local_80);
          if ((((byte)contents.data.size_ & 1) != 0) && ((options->fill_cache & 1U) != 0)) {
            sVar2 = Block::size((Block *)cache_handle);
            handle.size_ = (**(code **)(*arg1 + 0x10))
                                     (arg1,local_a8,cache_handle,sVar2,DeleteCachedBlock);
          }
        }
      }
      else {
        cache_handle = (Handle *)(**(code **)(*arg1 + 0x28))(arg1,handle.size_);
      }
    }
  }
  if (cache_handle == (Handle *)0x0) {
    local_c0 = NewErrorIterator((Status *)&contents.cachable);
  }
  else {
    local_c0 = Block::NewIterator((Block *)cache_handle,(Comparator *)**arg);
    if (handle.size_ == 0) {
      Iterator::RegisterCleanup(local_c0,DeleteBlock,cache_handle,(void *)0x0);
    }
    else {
      Iterator::RegisterCleanup(local_c0,ReleaseBlock,arg1,(void *)handle.size_);
    }
  }
  Status::~Status((Status *)&contents.cachable);
  return local_c0;
}

Assistant:

Iterator* Table::BlockReader(void* arg, const ReadOptions& options,
                             const Slice& index_value) {
  Table* table = reinterpret_cast<Table*>(arg);
  Cache* block_cache = table->rep_->options.block_cache;
  Block* block = nullptr;
  Cache::Handle* cache_handle = nullptr;

  BlockHandle handle;
  Slice input = index_value;
  Status s = handle.DecodeFrom(&input);
  // We intentionally allow extra stuff in index_value so that we
  // can add more features in the future.

  if (s.ok()) {
    BlockContents contents;
    if (block_cache != nullptr) {
      char cache_key_buffer[16];
      EncodeFixed64(cache_key_buffer, table->rep_->cache_id);
      EncodeFixed64(cache_key_buffer + 8, handle.offset());
      Slice key(cache_key_buffer, sizeof(cache_key_buffer));
      cache_handle = block_cache->Lookup(key);
      if (cache_handle != nullptr) {
        block = reinterpret_cast<Block*>(block_cache->Value(cache_handle));
      } else {
        s = ReadBlock(table->rep_->file, options, handle, &contents);
        if (s.ok()) {
          block = new Block(contents);
          if (contents.cachable && options.fill_cache) {
            cache_handle = block_cache->Insert(key, block, block->size(),
                                               &DeleteCachedBlock);
          }
        }
      }
    } else {
      s = ReadBlock(table->rep_->file, options, handle, &contents);
      if (s.ok()) {
        block = new Block(contents);
      }
    }
  }

  Iterator* iter;
  if (block != nullptr) {
    iter = block->NewIterator(table->rep_->options.comparator);
    if (cache_handle == nullptr) {
      iter->RegisterCleanup(&DeleteBlock, block, nullptr);
    } else {
      iter->RegisterCleanup(&ReleaseBlock, block_cache, cache_handle);
    }
  } else {
    iter = NewErrorIterator(s);
  }
  return iter;
}